

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_OnObjectExpectedButNotCalled_Test::
TEST_MockCallTest_OnObjectExpectedButNotCalled_Test
          (TEST_MockCallTest_OnObjectExpectedButNotCalled_Test *this)

{
  TEST_MockCallTest_OnObjectExpectedButNotCalled_Test *this_local;
  
  memset(this,0,8);
  TEST_GROUP_CppUTestGroupMockCallTest::TEST_GROUP_CppUTestGroupMockCallTest
            (&this->super_TEST_GROUP_CppUTestGroupMockCallTest);
  (this->super_TEST_GROUP_CppUTestGroupMockCallTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_MockCallTest_OnObjectExpectedButNotCalled_Test_00354b08;
  return;
}

Assistant:

TEST(MockCallTest, OnObjectExpectedButNotCalled)
{
    MockFailureReporterInstaller failureReporterInstaller;

    void* objectPtr = (void*) 0x001;
    MockExpectedCallsListForTest expectations;
    expectations.addFunction("boo")->onObject(objectPtr);
    expectations.addFunction("boo")->onObject(objectPtr);

    mock().expectOneCall("boo").onObject(objectPtr);
    mock().expectOneCall("boo").onObject(objectPtr);
    mock().actualCall("boo");
    mock().actualCall("boo");

    MockExpectedObjectDidntHappenFailure expectedFailure(mockFailureTest(), "boo", expectations);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}